

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O1

int dwarf_dnames_name(Dwarf_Dnames_Head dn,Dwarf_Unsigned name_index,Dwarf_Unsigned *bucket_number,
                     Dwarf_Unsigned *hash_value,Dwarf_Unsigned *offset_to_debug_str,char **ptrtostr,
                     Dwarf_Unsigned *offset_in_entrypool,Dwarf_Unsigned *abbrev_code,
                     Dwarf_Half *abbrev_tag,Dwarf_Unsigned array_size,Dwarf_Half *idxattr_array,
                     Dwarf_Half *form_array,Dwarf_Unsigned *attr_count,Dwarf_Error *error)

{
  Dwarf_Debug dbg;
  Dwarf_Small *areaptr;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *msg;
  Dwarf_Unsigned *pDVar4;
  Dwarf_Unsigned DVar5;
  ulong uVar6;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned local_58;
  Dwarf_D_Abbrev_s *local_50;
  Dwarf_Unsigned local_48;
  Dwarf_Small *local_40;
  Dwarf_Small *local_38;
  
  local_50 = (Dwarf_D_Abbrev_s *)0x0;
  local_48 = 0;
  msg = "DW_DLE_DBG_NULL: a call to dwarf_dnames_name() Passes in a NULL or uninitialized pointer";
  if ((dn != (Dwarf_Dnames_Head)0x0) && (dn->dn_magic == 0xabcd)) {
    dbg = dn->dn_dbg;
    msg = 
    "DW_DLE_DBG_NULL: a call to dwarf_dnames_name() finds a NULL Dwarf_Debug in a Dwarf_Dnames_Head"
    ;
    if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
      if (name_index == 0) {
        return -1;
      }
      if (dn->dn_name_count < name_index) {
        return -1;
      }
      if ((dn->dn_bucket_count != 0) && (dn->dn_bucket_array != (Dwarf_DN_Bucket_s *)0x0)) {
        pDVar4 = &dn->dn_bucket_array->db_collisioncount;
        DVar5 = 0;
        do {
          bVar1 = false;
          if ((((Dwarf_DN_Bucket_s *)(pDVar4 + -1))->db_nameindex != 0) &&
             (name_index <= (((Dwarf_DN_Bucket_s *)(pDVar4 + -1))->db_nameindex - 1) + *pDVar4)) {
            *bucket_number = DVar5;
            bVar1 = true;
          }
          if (bVar1) {
            iVar3 = get_hash_value_number(dn,name_index,hash_value,error);
            if (iVar3 == 1) {
              return 1;
            }
            break;
          }
          DVar5 = DVar5 + 1;
          pDVar4 = pDVar4 + 2;
        } while (DVar5 < dn->dn_bucket_count);
      }
      uVar6 = (ulong)dn->dn_offset_size;
      local_38 = dn->dn_abbrevs;
      local_58 = 0;
      local_40 = dn->dn_string_offsets + (name_index - 1) * uVar6 + uVar6;
      if (local_38 < local_40) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        DVar5 = 0;
      }
      else {
        (*dbg->de_copy_word)(&local_58,dn->dn_string_offsets + (name_index - 1) * uVar6,uVar6);
        DVar5 = local_58;
      }
      if (local_38 < local_40) {
        return 1;
      }
      if (offset_to_debug_str != (Dwarf_Unsigned *)0x0) {
        *offset_to_debug_str = DVar5;
      }
      if (local_38 < local_40) {
        return 1;
      }
      areaptr = (dbg->de_debug_str).dss_data;
      iVar2 = _dwarf_check_string_valid
                        (dbg,areaptr,areaptr + DVar5,areaptr + (dbg->de_debug_str).dss_size,0x169,
                         error);
      iVar3 = iVar2;
      if ((iVar2 == 0) && (iVar3 = 1, ptrtostr != (char **)0x0)) {
        *ptrtostr = (char *)(areaptr + DVar5);
      }
      if (iVar2 != 0) {
        return iVar3;
      }
      uVar6 = (ulong)dn->dn_offset_size;
      local_58 = 0;
      if (dn->dn_abbrevs < dn->dn_entry_offsets + (name_index - 1) * uVar6 + uVar6) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        iVar3 = 1;
        DVar5 = 0;
        bVar1 = false;
      }
      else {
        (*dbg->de_copy_word)(&local_58,dn->dn_entry_offsets + (name_index - 1) * uVar6,uVar6);
        DVar5 = local_58;
        if (local_58 < dn->dn_entry_pool_size) {
          bVar1 = true;
          if (offset_in_entrypool != (Dwarf_Unsigned *)0x0) {
            *offset_in_entrypool = local_58;
          }
        }
        else {
          _dwarf_error_string(dbg,error,0x1e4,
                              "DW_DLE_DEBUG_NAMES_ERROR: The entrypool offset read is larger thanthe entrypool size"
                             );
          iVar3 = 1;
          bVar1 = false;
        }
      }
      if (!bVar1) {
        return iVar3;
      }
      iVar3 = _dwarf_read_abbrev_code_from_pool(dn,DVar5,&local_48,error);
      DVar5 = local_48;
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = _dwarf_find_abbrev_for_code(dn,local_48,&local_50,error);
      if (iVar3 != 0) {
        return 1;
      }
      if (abbrev_code != (Dwarf_Unsigned *)0x0) {
        *abbrev_code = DVar5;
      }
      if (abbrev_tag != (Dwarf_Half *)0x0 && DVar5 != 0) {
        *abbrev_tag = (Dwarf_Half)local_50->da_tag;
      }
      if (DVar5 == 0) {
        return 0;
      }
      if (attr_count != (Dwarf_Unsigned *)0x0) {
        *attr_count = local_50->da_pairs_count;
      }
      if (local_50->da_pairs_count < array_size) {
        array_size = local_50->da_pairs_count;
      }
      if (array_size == 0) {
        return 0;
      }
      uVar6 = 0;
      do {
        idxattr_array[uVar6] = local_50->da_idxattr[uVar6];
        form_array[uVar6] = local_50->da_form[uVar6];
        uVar6 = uVar6 + 1;
      } while (array_size != uVar6);
      return 0;
    }
  }
  _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,msg);
  return 1;
}

Assistant:

int
dwarf_dnames_name(Dwarf_Dnames_Head dn,
    Dwarf_Unsigned      name_index,
    Dwarf_Unsigned    * bucket_number,
    Dwarf_Unsigned    * hash_value,
    Dwarf_Unsigned    * offset_to_debug_str,
    char *            * ptrtostr ,
    Dwarf_Unsigned    * offset_in_entrypool,
    Dwarf_Unsigned    * abbrev_code,
    Dwarf_Half        * abbrev_tag,
    Dwarf_Unsigned      array_size,
    Dwarf_Half        * idxattr_array,
    Dwarf_Half        * form_array,
    Dwarf_Unsigned    * attr_count,
    Dwarf_Error *       error)
{
    Dwarf_Debug dbg                     = 0;
    int res                             = 0;
    Dwarf_Unsigned entrypooloffset      = 0;
    Dwarf_Unsigned debugstroffset       = 0;
    Dwarf_Small * strpointer            = 0;
    struct Dwarf_D_Abbrev_s *abbrevdata = 0;
    Dwarf_Unsigned code                 = 0;

    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "a call to dwarf_dnames_name() "
            "Passes in a NULL or uninitialized pointer");
        return DW_DLV_ERROR;
    }
    dbg = dn->dn_dbg;
    if (IS_INVALID_DBG(dbg)) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "a call to dwarf_dnames_name() "
            "finds a NULL Dwarf_Debug in a Dwarf_Dnames_Head");
        return DW_DLV_ERROR;
    }
    if (!name_index || name_index > dn->dn_name_count) {
        return DW_DLV_NO_ENTRY;
    }
    res = get_bucket_number(dn,name_index,bucket_number);
    if (res == DW_DLV_OK) {
        res = get_hash_value_number(dn,name_index,hash_value,error);
        if (res == DW_DLV_ERROR) {
            return res;
        }
    }
    {
        Dwarf_Small *ptr = dn->dn_string_offsets +
            (name_index-1) * dn->dn_offset_size;
        Dwarf_Small *endptr = dn->dn_abbrevs;

        READ_UNALIGNED_CK(dbg, debugstroffset, Dwarf_Unsigned,
            ptr, dn->dn_offset_size,
            error,endptr);
        if (offset_to_debug_str) {
            *offset_to_debug_str = debugstroffset;
        }
    }
    /* Get str ptr from .debug_str */
    {
        Dwarf_Small *secdataptr = 0;
        Dwarf_Unsigned secdatalen = 0;
        Dwarf_Small *secend = 0;
        int res_s = 0;

        secdataptr = (Dwarf_Small *)dbg->de_debug_str.dss_data;
        secdatalen = dbg->de_debug_str.dss_size;
        secend = secdataptr+secdatalen;
        strpointer = secdataptr +debugstroffset;
        res_s = _dwarf_check_string_valid(dbg,
            secdataptr,strpointer,secend,
            DW_DLE_FORM_STRING_BAD_STRING,error);
        if (res_s != DW_DLV_OK) {
            return res_s;
        }
        if (ptrtostr) {
            *ptrtostr = (char *)strpointer;
        }
    }

    {
        Dwarf_Small *ptr = dn->dn_entry_offsets +
            (name_index-1) * dn->dn_offset_size;
        Dwarf_Small *endptr = dn->dn_abbrevs;
        /*  offsets relative to the start of the
            entry_pool */

        READ_UNALIGNED_CK(dbg, entrypooloffset, Dwarf_Unsigned,
            ptr, dn->dn_offset_size,
            error,endptr);
        if (entrypooloffset >= dn->dn_entry_pool_size) {
            _dwarf_error_string(dbg, error,DW_DLE_DEBUG_NAMES_ERROR,
                "DW_DLE_DEBUG_NAMES_ERROR: "
                "The entrypool offset read is larger than"
                "the entrypool size");
            return DW_DLV_ERROR;
        }
        if (offset_in_entrypool) {
            *offset_in_entrypool = entrypooloffset;
        }
    }
    /*   Find abbrev code at the given entry offset */
    res = _dwarf_read_abbrev_code_from_pool(dn,
        entrypooloffset, &code,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    res = _dwarf_find_abbrev_for_code(dn,code,&abbrevdata,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }

    if (abbrev_code) {
        *abbrev_code =  code;
    }
    if (code && abbrev_tag) {
        *abbrev_tag =  (Dwarf_Half)abbrevdata->da_tag;
    }
    if (code) {
        if (attr_count) {
            *attr_count = abbrevdata->da_pairs_count;
        }
        res = _dwarf_fill_in_attr_form(dn,abbrevdata,idxattr_array,
            form_array, array_size,error);
        if (res == DW_DLV_ERROR) {
            return res;
        }
    }
    return DW_DLV_OK;
}